

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int mbedtls_sha512_update_ret(mbedtls_sha512_context *ctx,uchar *input,size_t ilen)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  uint local_3c;
  uint left;
  size_t fill;
  size_t sStack_28;
  int ret;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_sha512_context *ctx_local;
  
  if (ilen != 0) {
    uVar1 = ctx->total[0];
    local_3c = (uint)uVar1 & 0x7f;
    __n = (ulong)(0x80 - local_3c);
    ctx->total[0] = ilen + ctx->total[0];
    if (ctx->total[0] < ilen) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    sStack_28 = ilen;
    ilen_local = (size_t)input;
    if (((uVar1 & 0x7f) != 0) && (__n <= ilen)) {
      memcpy(ctx->buffer + local_3c,input,__n);
      iVar2 = mbedtls_internal_sha512_process(ctx,ctx->buffer);
      if (iVar2 != 0) {
        return iVar2;
      }
      ilen_local = (size_t)(input + __n);
      sStack_28 = ilen - __n;
      local_3c = 0;
    }
    for (; 0x7f < sStack_28; sStack_28 = sStack_28 - 0x80) {
      iVar2 = mbedtls_internal_sha512_process(ctx,(uchar *)ilen_local);
      if (iVar2 != 0) {
        return iVar2;
      }
      ilen_local = ilen_local + 0x80;
    }
    if (sStack_28 != 0) {
      memcpy(ctx->buffer + local_3c,(void *)ilen_local,sStack_28);
    }
  }
  return 0;
}

Assistant:

int mbedtls_sha512_update_ret( mbedtls_sha512_context *ctx,
                               const unsigned char *input,
                               size_t ilen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t fill;
    unsigned int left;

    SHA512_VALIDATE_RET( ctx != NULL );
    SHA512_VALIDATE_RET( ilen == 0 || input != NULL );

    if( ilen == 0 )
        return( 0 );

    left = (unsigned int) (ctx->total[0] & 0x7F);
    fill = 128 - left;

    ctx->total[0] += (uint64_t) ilen;

    if( ctx->total[0] < (uint64_t) ilen )
        ctx->total[1]++;

    if( left && ilen >= fill )
    {
        memcpy( (void *) (ctx->buffer + left), input, fill );

        if( ( ret = mbedtls_internal_sha512_process( ctx, ctx->buffer ) ) != 0 )
            return( ret );

        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while( ilen >= 128 )
    {
        if( ( ret = mbedtls_internal_sha512_process( ctx, input ) ) != 0 )
            return( ret );

        input += 128;
        ilen  -= 128;
    }

    if( ilen > 0 )
        memcpy( (void *) (ctx->buffer + left), input, ilen );

    return( 0 );
}